

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory_Banks.c
# Opt level: O0

uint8_t gb_read_none(MemoryBankController *mc,uint16_t address)

{
  uint16_t address_local;
  MemoryBankController *mc_local;
  
  if (address < 0x8000) {
    mc_local._7_1_ = mc->rom[address];
  }
  else if ((address < 0xa000) || (0xbfff < address)) {
    mc_local._7_1_ = gb_common_reads(mc,address);
  }
  else {
    mc_local._7_1_ = 0xff;
  }
  return mc_local._7_1_;
}

Assistant:

uint8_t gb_read_none(MemoryBankController* mc, uint16_t address) {

    if(address <= 0x7FFF) {
        return mc->rom[address];
    }

    //No licensed games use rom+ram, so we just return 0xFF     
    if (address >= 0xA000 && address <= 0xBFFF) {
        return 0xFF;
    }

    return gb_common_reads(mc, address);
}